

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O0

void accum_global_gauden_dnom
               (float32 ***dnom,float32 ***l_dnom,gauden_t *g,uint32 *lcl2glb,uint32 n_lcl2glb)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint local_44;
  uint local_40;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 ii;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_lcl2glb_local;
  uint32 *lcl2glb_local;
  gauden_t *g_local;
  float32 ***l_dnom_local;
  float32 ***dnom_local;
  
  if (dnom == (float32 ***)0x0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
            ,0x19e,"accum_global_gauden_dnom() called with NULL dnom\n");
  }
  else {
    uVar1 = g->n_feat;
    uVar2 = g->n_density;
    for (j = 0; j < n_lcl2glb; j = j + 1) {
      uVar3 = lcl2glb[j];
      for (local_40 = 0; local_40 < uVar1; local_40 = local_40 + 1) {
        for (local_44 = 0; local_44 < uVar2; local_44 = local_44 + 1) {
          dnom[uVar3][local_40][local_44] =
               (float32)((float)l_dnom[j][local_40][local_44] +
                        (float)dnom[uVar3][local_40][local_44]);
        }
      }
    }
  }
  return;
}

Assistant:

void
accum_global_gauden_dnom(float32 ***dnom,
			 float32 ***l_dnom,
			 gauden_t *g,
			 uint32 *lcl2glb,
			 uint32 n_lcl2glb)
{
    uint32 n_feat;
    uint32 n_density;
    uint32 ii, i, j, k;

    if (dnom == NULL) {
	/* nothing to do */
	E_WARN("accum_global_gauden_dnom() called with NULL dnom\n");
	return;
    }

    n_feat = gauden_n_feat(g);
    n_density = gauden_n_density(g);

    for (ii = 0; ii < n_lcl2glb; ii++) {
	i = lcl2glb[ii];	/* find out the global id */
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		/* accumulate the local posterior into the global one */
		dnom[i][j][k] += l_dnom[ii][j][k];
	    }
	}
    }
}